

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_test.c
# Opt level: O1

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  int iVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  int iVar105;
  int iVar106;
  int iVar107;
  int iVar108;
  int iVar109;
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  int iVar114;
  int iVar115;
  int iVar116;
  int iVar117;
  int iVar118;
  int iVar119;
  int iVar120;
  int iVar121;
  int iVar122;
  int iVar123;
  int iVar124;
  int iVar125;
  int iVar126;
  int iVar127;
  int iVar128;
  int iVar129;
  int iVar130;
  int iVar131;
  int iVar132;
  int iVar133;
  int iVar134;
  int iVar135;
  int iVar136;
  int iVar137;
  int iVar138;
  int iVar139;
  int iVar140;
  int iVar141;
  int iVar142;
  int iVar143;
  int iVar144;
  int iVar145;
  int iVar146;
  int iVar147;
  int iVar148;
  int iVar149;
  int iVar150;
  int iVar151;
  int iVar152;
  int iVar153;
  int iVar154;
  int iVar155;
  int iVar156;
  int iVar157;
  int iVar158;
  int iVar159;
  int iVar160;
  int iVar161;
  int iVar162;
  int iVar163;
  int iVar164;
  int iVar165;
  int iVar166;
  int iVar167;
  int iVar168;
  int iVar169;
  int iVar170;
  int iVar171;
  int iVar172;
  int iVar173;
  int iVar174;
  int iVar175;
  int iVar176;
  int iVar177;
  int iVar178;
  int iVar179;
  int iVar180;
  int iVar181;
  int iVar182;
  int iVar183;
  int iVar184;
  int iVar185;
  int iVar186;
  int iVar187;
  int iVar188;
  int iVar189;
  int iVar190;
  int iVar191;
  int iVar192;
  int iVar193;
  int iVar194;
  int iVar195;
  int iVar196;
  int iVar197;
  int iVar198;
  int iVar199;
  int iVar200;
  int iVar201;
  int iVar202;
  int iVar203;
  int iVar204;
  int iVar205;
  int iVar206;
  int iVar207;
  int iVar208;
  int iVar209;
  int iVar210;
  int iVar211;
  int iVar212;
  int iVar213;
  int iVar214;
  int iVar215;
  int iVar216;
  int iVar217;
  int iVar218;
  int iVar219;
  int iVar220;
  int iVar221;
  int iVar222;
  int iVar223;
  int iVar224;
  int iVar225;
  int iVar226;
  int iVar227;
  int iVar228;
  int iVar229;
  int iVar230;
  int iVar231;
  int iVar232;
  int iVar233;
  int iVar234;
  int iVar235;
  int iVar236;
  int iVar237;
  int iVar238;
  int iVar239;
  int iVar240;
  int iVar241;
  int iVar242;
  int iVar243;
  int iVar244;
  int iVar245;
  int iVar246;
  int iVar247;
  int iVar248;
  int iVar249;
  int iVar250;
  int iVar251;
  int iVar252;
  int iVar253;
  int iVar254;
  int iVar255;
  int iVar256;
  int iVar257;
  int iVar258;
  int iVar259;
  int iVar260;
  int iVar261;
  int iVar262;
  int iVar263;
  int iVar264;
  int iVar265;
  int iVar266;
  int iVar267;
  int iVar268;
  int iVar269;
  int iVar270;
  int iVar271;
  int iVar272;
  int iVar273;
  int iVar274;
  int iVar275;
  int iVar276;
  int iVar277;
  int iVar278;
  int iVar279;
  int iVar280;
  int iVar281;
  int iVar282;
  int iVar283;
  int iVar284;
  int iVar285;
  int iVar286;
  int iVar287;
  int iVar288;
  int iVar289;
  int iVar290;
  int iVar291;
  int iVar292;
  int iVar293;
  int iVar294;
  int iVar295;
  int iVar296;
  int iVar297;
  int iVar298;
  int iVar299;
  int iVar300;
  int iVar301;
  int iVar302;
  int iVar303;
  int iVar304;
  int iVar305;
  int iVar306;
  int iVar307;
  int iVar308;
  int iVar309;
  int iVar310;
  int iVar311;
  int iVar312;
  int iVar313;
  int iVar314;
  int iVar315;
  int iVar316;
  int iVar317;
  int iVar318;
  int iVar319;
  int iVar320;
  int iVar321;
  int iVar322;
  int iVar323;
  int iVar324;
  int iVar325;
  int iVar326;
  int iVar327;
  int iVar328;
  int iVar329;
  int iVar330;
  int iVar331;
  int iVar332;
  int iVar333;
  int iVar334;
  int iVar335;
  int iVar336;
  int iVar337;
  int iVar338;
  int iVar339;
  int iVar340;
  int iVar341;
  int iVar342;
  int iVar343;
  int iVar344;
  int iVar345;
  int iVar346;
  int iVar347;
  int iVar348;
  int iVar349;
  int iVar350;
  int iVar351;
  int iVar352;
  int iVar353;
  int iVar354;
  int iVar355;
  int iVar356;
  int iVar357;
  int iVar358;
  int iVar359;
  int iVar360;
  int iVar361;
  int iVar362;
  int iVar363;
  int iVar364;
  int iVar365;
  int iVar366;
  int iVar367;
  int iVar368;
  int iVar369;
  int iVar370;
  int iVar371;
  int iVar372;
  int iVar373;
  int iVar374;
  int iVar375;
  int iVar376;
  int iVar377;
  int iVar378;
  int iVar379;
  int iVar380;
  int iVar381;
  int iVar382;
  int iVar383;
  int iVar384;
  int iVar385;
  int iVar386;
  int iVar387;
  int iVar388;
  int iVar389;
  int iVar390;
  int iVar391;
  int iVar392;
  int iVar393;
  int iVar394;
  int iVar395;
  int iVar396;
  int iVar397;
  int iVar398;
  int iVar399;
  int iVar400;
  int iVar401;
  int iVar402;
  int iVar403;
  int iVar404;
  int iVar405;
  int iVar406;
  int iVar407;
  int iVar408;
  int iVar409;
  int iVar410;
  int iVar411;
  int iVar412;
  int iVar413;
  int iVar414;
  int iVar415;
  int iVar416;
  int iVar417;
  int iVar418;
  int iVar419;
  int iVar420;
  int iVar421;
  int iVar422;
  int iVar423;
  int iVar424;
  int iVar425;
  int iVar426;
  int iVar427;
  int iVar428;
  int iVar429;
  int iVar430;
  int iVar431;
  int iVar432;
  int iVar433;
  int iVar434;
  int iVar435;
  int iVar436;
  int iVar437;
  int iVar438;
  int iVar439;
  int iVar440;
  int iVar441;
  int iVar442;
  int iVar443;
  int iVar444;
  int iVar445;
  int iVar446;
  int iVar447;
  int iVar448;
  int iVar449;
  int iVar450;
  int iVar451;
  int iVar452;
  int iVar453;
  int iVar454;
  uint uVar455;
  
  fwrite("Test group: equality\n",0x15,1,_stderr);
  iVar1 = version_test("0","0",0,0,0);
  iVar2 = version_test("0","0",0,0,0);
  iVar3 = version_test("0a","0a",0,0,0);
  iVar4 = version_test("0a","0a",0,0,0);
  iVar5 = version_test("a","a",0,0,0);
  iVar6 = version_test("a","a",0,0,0);
  iVar7 = version_test("a0","a0",0,0,0);
  iVar8 = version_test("a0","a0",0,0,0);
  iVar9 = version_test("0a1","0a1",0,0,0);
  iVar10 = version_test("0a1","0a1",0,0,0);
  iVar11 = version_test("0a1b2","0a1b2",0,0,0);
  iVar12 = version_test("0a1b2","0a1b2",0,0,0);
  iVar13 = version_test("1alpha1","1alpha1",0,0,0);
  iVar14 = version_test("1alpha1","1alpha1",0,0,0);
  iVar15 = version_test("foo","foo",0,0,0);
  iVar16 = version_test("foo","foo",0,0,0);
  iVar17 = version_test("1.2.3","1.2.3",0,0,0);
  iVar18 = version_test("1.2.3","1.2.3",0,0,0);
  iVar19 = version_test("hello.world","hello.world",0,0,0);
  iVar20 = version_test("hello.world","hello.world",0,0,0);
  fwrite("\nTest group: different number of components\n",0x2c,1,_stderr);
  iVar21 = version_test("1","1.0",0,0,0);
  iVar22 = version_test("1.0","1",0,0,0);
  iVar23 = version_test("1","1.0.0",0,0,0);
  iVar24 = version_test("1.0.0","1",0,0,0);
  iVar25 = version_test("1.0","1.0.0",0,0,0);
  iVar26 = version_test("1.0.0","1.0",0,0,0);
  iVar27 = version_test("1.0","1.0.0.0.0.0.0.0",0,0,0);
  iVar28 = version_test("1.0.0.0.0.0.0.0","1.0",0,0,0);
  fwrite("\nTest group: leading zeroes\n",0x1c,1,_stderr);
  iVar29 = version_test("00100.00100","100.100",0,0,0);
  iVar30 = version_test("100.100","00100.00100",0,0,0);
  iVar31 = version_test("0","00000000000000000",0,0,0);
  iVar32 = version_test("00000000000000000","0",0,0,0);
  fwrite("\nTest group: simple comparisons\n",0x20,1,_stderr);
  iVar33 = version_test("0.0.0","0.0.1",0,0,-1);
  iVar34 = version_test("0.0.1","0.0.0",0,0,1);
  iVar35 = version_test("0.0.1","0.0.2",0,0,-1);
  iVar36 = version_test("0.0.2","0.0.1",0,0,1);
  iVar37 = version_test("0.0.2","0.0.10",0,0,-1);
  iVar38 = version_test("0.0.10","0.0.2",0,0,1);
  iVar39 = version_test("0.0.2","0.1.0",0,0,-1);
  iVar40 = version_test("0.1.0","0.0.2",0,0,1);
  iVar41 = version_test("0.0.10","0.1.0",0,0,-1);
  iVar42 = version_test("0.1.0","0.0.10",0,0,1);
  iVar43 = version_test("0.1.0","0.1.1",0,0,-1);
  iVar44 = version_test("0.1.1","0.1.0",0,0,1);
  iVar45 = version_test("0.1.1","1.0.0",0,0,-1);
  iVar46 = version_test("1.0.0","0.1.1",0,0,1);
  iVar47 = version_test("1.0.0","10.0.0",0,0,-1);
  iVar48 = version_test("10.0.0","1.0.0",0,0,1);
  iVar49 = version_test("10.0.0","100.0.0",0,0,-1);
  iVar50 = version_test("100.0.0","10.0.0",0,0,1);
  iVar51 = version_test("10.10000.10000","11.0.0",0,0,-1);
  iVar52 = version_test("11.0.0","10.10000.10000",0,0,1);
  fwrite("\nTest group: long numbers\n",0x1a,1,_stderr);
  iVar53 = version_test("20160101","20160102",0,0,-1);
  iVar54 = version_test("20160102","20160101",0,0,1);
  iVar55 = version_test("999999999999999999","1000000000000000000",0,0,-1);
  iVar56 = version_test("1000000000000000000","999999999999999999",0,0,1);
  fwrite("\nTest group: very long numbers\n",0x1f,1,_stderr);
  iVar57 = version_test("99999999999999999999999999999999999998",
                        "99999999999999999999999999999999999999",0,0,-1);
  iVar58 = version_test("99999999999999999999999999999999999999",
                        "99999999999999999999999999999999999998",0,0,1);
  fwrite("\nTest group: letter addendum\n",0x1d,1,_stderr);
  iVar59 = version_test("1.0","1.0a",0,0,-1);
  iVar60 = version_test("1.0a","1.0",0,0,1);
  iVar61 = version_test("1.0a","1.0b",0,0,-1);
  iVar62 = version_test("1.0b","1.0a",0,0,1);
  iVar63 = version_test("1.0b","1.1",0,0,-1);
  iVar64 = version_test("1.1","1.0b",0,0,1);
  fwrite("\nTest group: letter vs. number\n",0x1f,1,_stderr);
  iVar65 = version_test("a","0",0,0,-1);
  iVar66 = version_test("0","a",0,0,1);
  iVar67 = version_test("1.a","1.0",0,0,-1);
  iVar68 = version_test("1.0","1.a",0,0,1);
  fwrite("\nTest group: letter-only component\n",0x23,1,_stderr);
  iVar69 = version_test("1.0.a","1.0.b",0,0,-1);
  iVar70 = version_test("1.0.b","1.0.a",0,0,1);
  iVar71 = version_test("1.0.b","1.0.c",0,0,-1);
  iVar72 = version_test("1.0.c","1.0.b",0,0,1);
  iVar73 = version_test("1.0.c","1.0",0,0,-1);
  iVar74 = version_test("1.0","1.0.c",0,0,1);
  iVar75 = version_test("1.0.c","1.0.0",0,0,-1);
  iVar76 = version_test("1.0.0","1.0.c",0,0,1);
  fwrite("\nTest group: letter component split\n",0x24,1,_stderr);
  iVar77 = version_test("1.0a0","1.0.a0",0,0,0);
  iVar78 = version_test("1.0.a0","1.0a0",0,0,0);
  iVar79 = version_test("1.0beta3","1.0.b3",0,0,0);
  iVar80 = version_test("1.0.b3","1.0beta3",0,0,0);
  fwrite("\nTest group: case is ignored\n",0x1d,1,_stderr);
  iVar81 = version_test("a","A",0,0,0);
  iVar82 = version_test("A","a",0,0,0);
  iVar83 = version_test("1alpha","1ALPHA",0,0,0);
  iVar84 = version_test("1ALPHA","1alpha",0,0,0);
  iVar85 = version_test("alpha1","ALPHA1",0,0,0);
  iVar86 = version_test("ALPHA1","alpha1",0,0,0);
  fwrite("\nTest group: strings are shortened to one letter\n",0x31,1,_stderr);
  iVar87 = version_test("a","alpha",0,0,0);
  iVar88 = version_test("alpha","a",0,0,0);
  iVar89 = version_test("b","beta",0,0,0);
  iVar90 = version_test("beta","b",0,0,0);
  iVar91 = version_test("p","prerelease",0,0,0);
  iVar92 = version_test("prerelease","p",0,0,0);
  fwrite("\nTest group: unusial component separators\n",0x2a,1,_stderr);
  iVar93 = version_test("1.0.alpha.2","1_0_alpha_2",0,0,0);
  iVar94 = version_test("1_0_alpha_2","1.0.alpha.2",0,0,0);
  iVar95 = version_test("1.0.alpha.2","1-0-alpha-2",0,0,0);
  iVar96 = version_test("1-0-alpha-2","1.0.alpha.2",0,0,0);
  iVar97 = version_test("1.0.alpha.2","1,0:alpha~2",0,0,0);
  iVar98 = version_test("1,0:alpha~2","1.0.alpha.2",0,0,0);
  fwrite("\nTest group: multiple consequentional separators\n",0x31,1,_stderr);
  iVar99 = version_test("..1....2....3..","1.2.3",0,0,0);
  iVar100 = version_test("1.2.3","..1....2....3..",0,0,0);
  iVar101 = version_test(".-~1~-.-~2~-.","1.2",0,0,0);
  iVar102 = version_test("1.2",".-~1~-.-~2~-.",0,0,0);
  iVar103 = version_test(".,:;~+-_","0",0,0,0);
  iVar104 = version_test("0",".,:;~+-_",0,0,0);
  fwrite("\nTest group: empty string\n",0x1a,1,_stderr);
  iVar105 = version_test("","",0,0,0);
  iVar106 = version_test("","",0,0,0);
  iVar107 = version_test("","0",0,0,0);
  iVar108 = version_test("0","",0,0,0);
  iVar109 = version_test("","1",0,0,-1);
  iVar110 = version_test("1","",0,0,1);
  fwrite("\nTest group: prerelease sequence\n",0x21,1,_stderr);
  iVar111 = version_test("1.0alpha1","1.0alpha2",0,0,-1);
  iVar112 = version_test("1.0alpha2","1.0alpha1",0,0,1);
  iVar113 = version_test("1.0alpha2","1.0beta1",0,0,-1);
  iVar114 = version_test("1.0beta1","1.0alpha2",0,0,1);
  iVar115 = version_test("1.0beta1","1.0beta2",0,0,-1);
  iVar116 = version_test("1.0beta2","1.0beta1",0,0,1);
  iVar117 = version_test("1.0beta2","1.0rc1",0,0,-1);
  iVar118 = version_test("1.0rc1","1.0beta2",0,0,1);
  iVar119 = version_test("1.0beta2","1.0pre1",0,0,-1);
  iVar120 = version_test("1.0pre1","1.0beta2",0,0,1);
  iVar121 = version_test("1.0rc1","1.0",0,0,-1);
  iVar122 = version_test("1.0","1.0rc1",0,0,1);
  iVar123 = version_test("1.0pre1","1.0",0,0,-1);
  iVar124 = version_test("1.0","1.0pre1",0,0,1);
  iVar125 = version_test("1.0.alpha1","1.0.alpha2",0,0,-1);
  iVar126 = version_test("1.0.alpha2","1.0.alpha1",0,0,1);
  iVar127 = version_test("1.0.alpha2","1.0.beta1",0,0,-1);
  iVar128 = version_test("1.0.beta1","1.0.alpha2",0,0,1);
  iVar129 = version_test("1.0.beta1","1.0.beta2",0,0,-1);
  iVar130 = version_test("1.0.beta2","1.0.beta1",0,0,1);
  iVar131 = version_test("1.0.beta2","1.0.rc1",0,0,-1);
  iVar132 = version_test("1.0.rc1","1.0.beta2",0,0,1);
  iVar133 = version_test("1.0.beta2","1.0.pre1",0,0,-1);
  iVar134 = version_test("1.0.pre1","1.0.beta2",0,0,1);
  iVar135 = version_test("1.0.rc1","1.0",0,0,-1);
  iVar136 = version_test("1.0","1.0.rc1",0,0,1);
  iVar137 = version_test("1.0.pre1","1.0",0,0,-1);
  iVar138 = version_test("1.0","1.0.pre1",0,0,1);
  iVar139 = version_test("1.0alpha.1","1.0alpha.2",0,0,-1);
  iVar140 = version_test("1.0alpha.2","1.0alpha.1",0,0,1);
  iVar141 = version_test("1.0alpha.2","1.0beta.1",0,0,-1);
  iVar142 = version_test("1.0beta.1","1.0alpha.2",0,0,1);
  iVar143 = version_test("1.0beta.1","1.0beta.2",0,0,-1);
  iVar144 = version_test("1.0beta.2","1.0beta.1",0,0,1);
  iVar145 = version_test("1.0beta.2","1.0rc.1",0,0,-1);
  iVar146 = version_test("1.0rc.1","1.0beta.2",0,0,1);
  iVar147 = version_test("1.0beta.2","1.0pre.1",0,0,-1);
  iVar148 = version_test("1.0pre.1","1.0beta.2",0,0,1);
  iVar149 = version_test("1.0rc.1","1.0",0,0,-1);
  iVar150 = version_test("1.0","1.0rc.1",0,0,1);
  iVar151 = version_test("1.0pre.1","1.0",0,0,-1);
  iVar152 = version_test("1.0","1.0pre.1",0,0,1);
  iVar153 = version_test("1.0.alpha.1","1.0.alpha.2",0,0,-1);
  iVar154 = version_test("1.0.alpha.2","1.0.alpha.1",0,0,1);
  iVar155 = version_test("1.0.alpha.2","1.0.beta.1",0,0,-1);
  iVar156 = version_test("1.0.beta.1","1.0.alpha.2",0,0,1);
  iVar157 = version_test("1.0.beta.1","1.0.beta.2",0,0,-1);
  iVar158 = version_test("1.0.beta.2","1.0.beta.1",0,0,1);
  iVar159 = version_test("1.0.beta.2","1.0.rc.1",0,0,-1);
  iVar160 = version_test("1.0.rc.1","1.0.beta.2",0,0,1);
  iVar161 = version_test("1.0.beta.2","1.0.pre.1",0,0,-1);
  iVar162 = version_test("1.0.pre.1","1.0.beta.2",0,0,1);
  iVar163 = version_test("1.0.rc.1","1.0",0,0,-1);
  iVar164 = version_test("1.0","1.0.rc.1",0,0,1);
  iVar165 = version_test("1.0.pre.1","1.0",0,0,-1);
  iVar166 = version_test("1.0","1.0.pre.1",0,0,1);
  fwrite("\nTest group: long word awareness\n",0x21,1,_stderr);
  iVar167 = version_test("1.0alpha-1","0.9",0,0,1);
  iVar168 = version_test("0.9","1.0alpha-1",0,0,-1);
  iVar169 = version_test("1.0alpha-1","1.0",0,0,-1);
  iVar170 = version_test("1.0","1.0alpha-1",0,0,1);
  iVar171 = version_test("1.0alpha-1","1.0.1",0,0,-1);
  iVar172 = version_test("1.0.1","1.0alpha-1",0,0,1);
  iVar173 = version_test("1.0alpha-1","1.1",0,0,-1);
  iVar174 = version_test("1.1","1.0alpha-1",0,0,1);
  iVar175 = version_test("1.0beta-1","0.9",0,0,1);
  iVar176 = version_test("0.9","1.0beta-1",0,0,-1);
  iVar177 = version_test("1.0beta-1","1.0",0,0,-1);
  iVar178 = version_test("1.0","1.0beta-1",0,0,1);
  iVar179 = version_test("1.0beta-1","1.0.1",0,0,-1);
  iVar180 = version_test("1.0.1","1.0beta-1",0,0,1);
  iVar181 = version_test("1.0beta-1","1.1",0,0,-1);
  iVar182 = version_test("1.1","1.0beta-1",0,0,1);
  iVar183 = version_test("1.0pre-1","0.9",0,0,1);
  iVar184 = version_test("0.9","1.0pre-1",0,0,-1);
  iVar185 = version_test("1.0pre-1","1.0",0,0,-1);
  iVar186 = version_test("1.0","1.0pre-1",0,0,1);
  iVar187 = version_test("1.0pre-1","1.0.1",0,0,-1);
  iVar188 = version_test("1.0.1","1.0pre-1",0,0,1);
  iVar189 = version_test("1.0pre-1","1.1",0,0,-1);
  iVar190 = version_test("1.1","1.0pre-1",0,0,1);
  iVar191 = version_test("1.0prerelease-1","0.9",0,0,1);
  iVar192 = version_test("0.9","1.0prerelease-1",0,0,-1);
  iVar193 = version_test("1.0prerelease-1","1.0",0,0,-1);
  iVar194 = version_test("1.0","1.0prerelease-1",0,0,1);
  iVar195 = version_test("1.0prerelease-1","1.0.1",0,0,-1);
  iVar196 = version_test("1.0.1","1.0prerelease-1",0,0,1);
  iVar197 = version_test("1.0prerelease-1","1.1",0,0,-1);
  iVar198 = version_test("1.1","1.0prerelease-1",0,0,1);
  iVar199 = version_test("1.0rc-1","0.9",0,0,1);
  iVar200 = version_test("0.9","1.0rc-1",0,0,-1);
  iVar201 = version_test("1.0rc-1","1.0",0,0,-1);
  iVar202 = version_test("1.0","1.0rc-1",0,0,1);
  iVar203 = version_test("1.0rc-1","1.0.1",0,0,-1);
  iVar204 = version_test("1.0.1","1.0rc-1",0,0,1);
  iVar205 = version_test("1.0rc-1","1.1",0,0,-1);
  iVar206 = version_test("1.1","1.0rc-1",0,0,1);
  fwrite("\nTest group: post-release keyword awareness\n",0x2c,1,_stderr);
  iVar207 = version_test("1.0patch1","0.9",0,0,1);
  iVar208 = version_test("0.9","1.0patch1",0,0,-1);
  iVar209 = version_test("1.0patch1","1.0",0,0,1);
  iVar210 = version_test("1.0","1.0patch1",0,0,-1);
  iVar211 = version_test("1.0patch1","1.0.1",0,0,-1);
  iVar212 = version_test("1.0.1","1.0patch1",0,0,1);
  iVar213 = version_test("1.0patch1","1.1",0,0,-1);
  iVar214 = version_test("1.1","1.0patch1",0,0,1);
  iVar215 = version_test("1.0.patch1","0.9",0,0,1);
  iVar216 = version_test("0.9","1.0.patch1",0,0,-1);
  iVar217 = version_test("1.0.patch1","1.0",0,0,1);
  iVar218 = version_test("1.0","1.0.patch1",0,0,-1);
  iVar219 = version_test("1.0.patch1","1.0.1",0,0,-1);
  iVar220 = version_test("1.0.1","1.0.patch1",0,0,1);
  iVar221 = version_test("1.0.patch1","1.1",0,0,-1);
  iVar222 = version_test("1.1","1.0.patch1",0,0,1);
  iVar223 = version_test("1.0patch.1","0.9",0,0,1);
  iVar224 = version_test("0.9","1.0patch.1",0,0,-1);
  iVar225 = version_test("1.0patch.1","1.0",0,0,1);
  iVar226 = version_test("1.0","1.0patch.1",0,0,-1);
  iVar227 = version_test("1.0patch.1","1.0.1",0,0,-1);
  iVar228 = version_test("1.0.1","1.0patch.1",0,0,1);
  iVar229 = version_test("1.0patch.1","1.1",0,0,-1);
  iVar230 = version_test("1.1","1.0patch.1",0,0,1);
  iVar231 = version_test("1.0.patch.1","0.9",0,0,1);
  iVar232 = version_test("0.9","1.0.patch.1",0,0,-1);
  iVar233 = version_test("1.0.patch.1","1.0",0,0,1);
  iVar234 = version_test("1.0","1.0.patch.1",0,0,-1);
  iVar235 = version_test("1.0.patch.1","1.0.1",0,0,-1);
  iVar236 = version_test("1.0.1","1.0.patch.1",0,0,1);
  iVar237 = version_test("1.0.patch.1","1.1",0,0,-1);
  iVar238 = version_test("1.1","1.0.patch.1",0,0,1);
  iVar239 = version_test("1.0post1","0.9",0,0,1);
  iVar240 = version_test("0.9","1.0post1",0,0,-1);
  iVar241 = version_test("1.0post1","1.0",0,0,1);
  iVar242 = version_test("1.0","1.0post1",0,0,-1);
  iVar243 = version_test("1.0post1","1.0.1",0,0,-1);
  iVar244 = version_test("1.0.1","1.0post1",0,0,1);
  iVar245 = version_test("1.0post1","1.1",0,0,-1);
  iVar246 = version_test("1.1","1.0post1",0,0,1);
  iVar247 = version_test("1.0postanythinggoeshere1","0.9",0,0,1);
  iVar248 = version_test("0.9","1.0postanythinggoeshere1",0,0,-1);
  iVar249 = version_test("1.0postanythinggoeshere1","1.0",0,0,1);
  iVar250 = version_test("1.0","1.0postanythinggoeshere1",0,0,-1);
  iVar251 = version_test("1.0postanythinggoeshere1","1.0.1",0,0,-1);
  iVar252 = version_test("1.0.1","1.0postanythinggoeshere1",0,0,1);
  iVar253 = version_test("1.0postanythinggoeshere1","1.1",0,0,-1);
  iVar254 = version_test("1.1","1.0postanythinggoeshere1",0,0,1);
  iVar255 = version_test("1.0pl1","0.9",0,0,1);
  iVar256 = version_test("0.9","1.0pl1",0,0,-1);
  iVar257 = version_test("1.0pl1","1.0",0,0,1);
  iVar258 = version_test("1.0","1.0pl1",0,0,-1);
  iVar259 = version_test("1.0pl1","1.0.1",0,0,-1);
  iVar260 = version_test("1.0.1","1.0pl1",0,0,1);
  iVar261 = version_test("1.0pl1","1.1",0,0,-1);
  iVar262 = version_test("1.1","1.0pl1",0,0,1);
  iVar263 = version_test("1.0errata1","0.9",0,0,1);
  iVar264 = version_test("0.9","1.0errata1",0,0,-1);
  iVar265 = version_test("1.0errata1","1.0",0,0,1);
  iVar266 = version_test("1.0","1.0errata1",0,0,-1);
  iVar267 = version_test("1.0errata1","1.0.1",0,0,-1);
  iVar268 = version_test("1.0.1","1.0errata1",0,0,1);
  iVar269 = version_test("1.0errata1","1.1",0,0,-1);
  iVar270 = version_test("1.1","1.0errata1",0,0,1);
  fwrite("\nTest group: p is patch flag\n",0x1d,1,_stderr);
  iVar271 = version_test("1.0p1","1.0p1",0,0,0);
  iVar272 = version_test("1.0p1","1.0p1",0,0,0);
  iVar273 = version_test("1.0p1","1.0p1",1,1,0);
  iVar274 = version_test("1.0p1","1.0p1",1,1,0);
  iVar275 = version_test("1.0p1","1.0p1",1,0,1);
  iVar276 = version_test("1.0p1","1.0p1",0,1,-1);
  iVar277 = version_test("1.0p1","1.0p1",0,1,-1);
  iVar278 = version_test("1.0p1","1.0p1",1,0,1);
  iVar279 = version_test("1.0p1","1.0P1",0,0,0);
  iVar280 = version_test("1.0P1","1.0p1",0,0,0);
  iVar281 = version_test("1.0p1","1.0P1",1,1,0);
  iVar282 = version_test("1.0P1","1.0p1",1,1,0);
  iVar283 = version_test("1.0","1.0p1",0,0,1);
  iVar284 = version_test("1.0p1","1.0",0,0,-1);
  iVar285 = version_test("1.0","1.0p1",1,0,1);
  iVar286 = version_test("1.0p1","1.0",0,1,-1);
  iVar287 = version_test("1.0","1.0p1",0,1,-1);
  iVar288 = version_test("1.0p1","1.0",1,0,1);
  iVar289 = version_test("1.0","1.0.p1",0,0,1);
  iVar290 = version_test("1.0.p1","1.0",0,0,-1);
  iVar291 = version_test("1.0","1.0.p1",1,0,1);
  iVar292 = version_test("1.0.p1","1.0",0,1,-1);
  iVar293 = version_test("1.0","1.0.p1",0,1,-1);
  iVar294 = version_test("1.0.p1","1.0",1,0,1);
  iVar295 = version_test("1.0","1.0.p.1",0,0,1);
  iVar296 = version_test("1.0.p.1","1.0",0,0,-1);
  iVar297 = version_test("1.0","1.0.p.1",1,0,1);
  iVar298 = version_test("1.0.p.1","1.0",0,1,-1);
  iVar299 = version_test("1.0","1.0.p.1",0,1,-1);
  iVar300 = version_test("1.0.p.1","1.0",1,0,1);
  iVar301 = version_test("1.0","1.0p.1",0,0,-1);
  iVar302 = version_test("1.0p.1","1.0",0,0,1);
  iVar303 = version_test("1.0","1.0p.1",1,0,-1);
  iVar304 = version_test("1.0p.1","1.0",0,1,1);
  iVar305 = version_test("1.0","1.0p.1",0,1,-1);
  iVar306 = version_test("1.0p.1","1.0",1,0,1);
  fwrite("\nTest group: any is patch flag\n",0x1f,1,_stderr);
  iVar307 = version_test("1.0a1","1.0a1",0,0,0);
  iVar308 = version_test("1.0a1","1.0a1",0,0,0);
  iVar309 = version_test("1.0a1","1.0a1",2,2,0);
  iVar310 = version_test("1.0a1","1.0a1",2,2,0);
  iVar311 = version_test("1.0a1","1.0a1",2,0,1);
  iVar312 = version_test("1.0a1","1.0a1",0,2,-1);
  iVar313 = version_test("1.0a1","1.0a1",0,2,-1);
  iVar314 = version_test("1.0a1","1.0a1",2,0,1);
  iVar315 = version_test("1.0","1.0a1",0,0,1);
  iVar316 = version_test("1.0a1","1.0",0,0,-1);
  iVar317 = version_test("1.0","1.0a1",2,0,1);
  iVar318 = version_test("1.0a1","1.0",0,2,-1);
  iVar319 = version_test("1.0","1.0a1",0,2,-1);
  iVar320 = version_test("1.0a1","1.0",2,0,1);
  iVar321 = version_test("1.0","1.0.a1",0,0,1);
  iVar322 = version_test("1.0.a1","1.0",0,0,-1);
  iVar323 = version_test("1.0","1.0.a1",2,0,1);
  iVar324 = version_test("1.0.a1","1.0",0,2,-1);
  iVar325 = version_test("1.0","1.0.a1",0,2,-1);
  iVar326 = version_test("1.0.a1","1.0",2,0,1);
  iVar327 = version_test("1.0","1.0.a.1",0,0,1);
  iVar328 = version_test("1.0.a.1","1.0",0,0,-1);
  iVar329 = version_test("1.0","1.0.a.1",2,0,1);
  iVar330 = version_test("1.0.a.1","1.0",0,2,-1);
  iVar331 = version_test("1.0","1.0.a.1",0,2,-1);
  iVar332 = version_test("1.0.a.1","1.0",2,0,1);
  iVar333 = version_test("1.0","1.0a.1",0,0,-1);
  iVar334 = version_test("1.0a.1","1.0",0,0,1);
  iVar335 = version_test("1.0","1.0a.1",2,0,-1);
  iVar336 = version_test("1.0a.1","1.0",0,2,1);
  iVar337 = version_test("1.0","1.0a.1",0,2,-1);
  iVar338 = version_test("1.0a.1","1.0",2,0,1);
  fwrite("\nTest group: p/patch compatibility\n",0x23,1,_stderr);
  iVar339 = version_test("1.0p1","1.0pre1",0,0,0);
  iVar340 = version_test("1.0pre1","1.0p1",0,0,0);
  iVar341 = version_test("1.0p1","1.0patch1",0,0,-1);
  iVar342 = version_test("1.0patch1","1.0p1",0,0,1);
  iVar343 = version_test("1.0p1","1.0post1",0,0,-1);
  iVar344 = version_test("1.0post1","1.0p1",0,0,1);
  iVar345 = version_test("1.0p1","1.0pre1",1,1,1);
  iVar346 = version_test("1.0pre1","1.0p1",1,1,-1);
  iVar347 = version_test("1.0p1","1.0patch1",1,1,0);
  iVar348 = version_test("1.0patch1","1.0p1",1,1,0);
  iVar349 = version_test("1.0p1","1.0post1",1,1,0);
  iVar350 = version_test("1.0post1","1.0p1",1,1,0);
  fwrite("\nTest group: prerelease words without numbers\n",0x2e,1,_stderr);
  iVar351 = version_test("1.0alpha","1.0",0,0,-1);
  iVar352 = version_test("1.0","1.0alpha",0,0,1);
  iVar353 = version_test("1.0.alpha","1.0",0,0,-1);
  iVar354 = version_test("1.0","1.0.alpha",0,0,1);
  iVar355 = version_test("1.0beta","1.0",0,0,-1);
  iVar356 = version_test("1.0","1.0beta",0,0,1);
  iVar357 = version_test("1.0.beta","1.0",0,0,-1);
  iVar358 = version_test("1.0","1.0.beta",0,0,1);
  iVar359 = version_test("1.0rc","1.0",0,0,-1);
  iVar360 = version_test("1.0","1.0rc",0,0,1);
  iVar361 = version_test("1.0.rc","1.0",0,0,-1);
  iVar362 = version_test("1.0","1.0.rc",0,0,1);
  iVar363 = version_test("1.0pre","1.0",0,0,-1);
  iVar364 = version_test("1.0","1.0pre",0,0,1);
  iVar365 = version_test("1.0.pre","1.0",0,0,-1);
  iVar366 = version_test("1.0","1.0.pre",0,0,1);
  iVar367 = version_test("1.0prerelese","1.0",0,0,-1);
  iVar368 = version_test("1.0","1.0prerelese",0,0,1);
  iVar369 = version_test("1.0.prerelese","1.0",0,0,-1);
  iVar370 = version_test("1.0","1.0.prerelese",0,0,1);
  iVar371 = version_test("1.0patch","1.0",0,0,1);
  iVar372 = version_test("1.0","1.0patch",0,0,-1);
  iVar373 = version_test("1.0.patch","1.0",0,0,1);
  iVar374 = version_test("1.0","1.0.patch",0,0,-1);
  fwrite("\nTest group: release bounds\n",0x1c,1,_stderr);
  iVar375 = version_test("0.99999","1.0",0,0,-1);
  iVar376 = version_test("1.0","0.99999",0,0,1);
  iVar377 = version_test("1.0alpha","1.0",0,0,-1);
  iVar378 = version_test("1.0","1.0alpha",0,0,1);
  iVar379 = version_test("1.0alpha0","1.0",0,0,-1);
  iVar380 = version_test("1.0","1.0alpha0",0,0,1);
  iVar381 = version_test("1.0","1.0",0,0,0);
  iVar382 = version_test("1.0","1.0",0,0,0);
  iVar383 = version_test("1.0patch","1.0",0,0,1);
  iVar384 = version_test("1.0","1.0patch",0,0,-1);
  iVar385 = version_test("1.0patch0","1.0",0,0,1);
  iVar386 = version_test("1.0","1.0patch0",0,0,-1);
  iVar387 = version_test("1.0.1","1.0",0,0,1);
  iVar388 = version_test("1.0","1.0.1",0,0,-1);
  iVar389 = version_test("1.1","1.0",0,0,1);
  iVar390 = version_test("1.0","1.1",0,0,-1);
  iVar391 = version_test("0.99999","1.0",0,4,-1);
  iVar392 = version_test("1.0","0.99999",4,0,1);
  iVar393 = version_test("1.0alpha","1.0",0,4,1);
  iVar394 = version_test("1.0","1.0alpha",4,0,-1);
  iVar395 = version_test("1.0alpha0","1.0",0,4,1);
  iVar396 = version_test("1.0","1.0alpha0",4,0,-1);
  iVar397 = version_test("1.0","1.0",0,4,1);
  iVar398 = version_test("1.0","1.0",4,0,-1);
  iVar399 = version_test("1.0patch","1.0",0,4,1);
  iVar400 = version_test("1.0","1.0patch",4,0,-1);
  iVar401 = version_test("1.0patch0","1.0",0,4,1);
  iVar402 = version_test("1.0","1.0patch0",4,0,-1);
  iVar403 = version_test("1.0a","1.0",0,4,1);
  iVar404 = version_test("1.0","1.0a",4,0,-1);
  iVar405 = version_test("1.0.1","1.0",0,4,1);
  iVar406 = version_test("1.0","1.0.1",4,0,-1);
  iVar407 = version_test("1.1","1.0",0,4,1);
  iVar408 = version_test("1.0","1.1",4,0,-1);
  iVar409 = version_test("0.99999","1.0",0,8,-1);
  iVar410 = version_test("1.0","0.99999",8,0,1);
  iVar411 = version_test("1.0alpha","1.0",0,8,-1);
  iVar412 = version_test("1.0","1.0alpha",8,0,1);
  iVar413 = version_test("1.0alpha0","1.0",0,8,-1);
  iVar414 = version_test("1.0","1.0alpha0",8,0,1);
  iVar415 = version_test("1.0","1.0",0,8,-1);
  iVar416 = version_test("1.0","1.0",8,0,1);
  iVar417 = version_test("1.0patch","1.0",0,8,-1);
  iVar418 = version_test("1.0","1.0patch",8,0,1);
  iVar419 = version_test("1.0patch0","1.0",0,8,-1);
  iVar420 = version_test("1.0","1.0patch0",8,0,1);
  iVar421 = version_test("1.0a","1.0",0,8,-1);
  iVar422 = version_test("1.0","1.0a",8,0,1);
  iVar423 = version_test("1.0.1","1.0",0,8,-1);
  iVar424 = version_test("1.0","1.0.1",8,0,1);
  iVar425 = version_test("1.1","1.0",0,8,1);
  iVar426 = version_test("1.0","1.1",8,0,-1);
  iVar427 = version_test("1.0","1.0",4,4,0);
  iVar428 = version_test("1.0","1.0",4,4,0);
  iVar429 = version_test("1.0","1.0",8,8,0);
  iVar430 = version_test("1.0","1.0",8,8,0);
  iVar431 = version_test("1.0","1.0",4,8,-1);
  iVar432 = version_test("1.0","1.0",8,4,1);
  iVar433 = version_test("1.0","1.1",8,4,-1);
  iVar434 = version_test("1.1","1.0",4,8,1);
  iVar435 = version_test("0","0.0",8,8,1);
  iVar436 = version_test("0.0","0",8,8,-1);
  iVar437 = version_test("0","0.0",4,4,-1);
  iVar438 = version_test("0.0","0",4,4,1);
  fwrite("\nTest group: uniform component splitting\n",0x29,1,_stderr);
  iVar439 = version_test("1.0alpha1","1.0alpha1",0,0,0);
  iVar440 = version_test("1.0alpha1","1.0alpha1",0,0,0);
  iVar441 = version_test("1.0alpha1","1.0.alpha1",0,0,0);
  iVar442 = version_test("1.0.alpha1","1.0alpha1",0,0,0);
  iVar443 = version_test("1.0alpha1","1.0alpha.1",0,0,0);
  iVar444 = version_test("1.0alpha.1","1.0alpha1",0,0,0);
  iVar445 = version_test("1.0alpha1","1.0.alpha.1",0,0,0);
  iVar446 = version_test("1.0.alpha.1","1.0alpha1",0,0,0);
  iVar447 = version_test("1.0patch1","1.0patch1",0,0,0);
  iVar448 = version_test("1.0patch1","1.0patch1",0,0,0);
  iVar449 = version_test("1.0patch1","1.0.patch1",0,0,0);
  iVar450 = version_test("1.0.patch1","1.0patch1",0,0,0);
  iVar451 = version_test("1.0patch1","1.0patch.1",0,0,0);
  iVar452 = version_test("1.0patch.1","1.0patch1",0,0,0);
  iVar453 = version_test("1.0patch1","1.0.patch.1",0,0,0);
  iVar454 = version_test("1.0.patch.1","1.0patch1",0,0,0);
  uVar455 = iVar438 + iVar437 + iVar439 + iVar440 + iVar441 + iVar442 + iVar443 + iVar444 + iVar445
            + iVar446 + iVar447 + iVar448 + iVar449 + iVar450 + iVar451 + iVar452 + iVar453 +
            iVar409 + iVar408 + iVar410 + iVar411 + iVar412 + iVar413 + iVar414 + iVar415 + iVar416
            + iVar417 + iVar418 + iVar419 + iVar420 + iVar421 + iVar422 + iVar423 + iVar424 +
            iVar425 + iVar426 + iVar427 + iVar428 + iVar429 + iVar430 + iVar431 + iVar432 + iVar433
            + iVar434 + iVar435 + iVar436 +
            iVar381 + iVar380 + iVar382 + iVar383 + iVar384 + iVar385 + iVar386 + iVar387 + iVar388
            + iVar389 + iVar390 + iVar391 + iVar392 + iVar393 + iVar394 + iVar395 + iVar396 +
            iVar397 + iVar398 + iVar399 + iVar400 + iVar401 + iVar402 + iVar403 + iVar404 + iVar405
            + iVar406 + iVar407 +
            iVar354 + iVar353 + iVar355 + iVar356 + iVar357 + iVar358 + iVar359 + iVar360 + iVar361
            + iVar362 + iVar363 + iVar364 + iVar365 + iVar366 + iVar367 + iVar368 + iVar369 +
            iVar370 + iVar371 + iVar372 + iVar373 + iVar374 + iVar375 + iVar376 + iVar377 + iVar378
            + iVar379 +
            iVar328 + iVar327 + iVar329 + iVar330 + iVar331 + iVar332 + iVar333 + iVar334 + iVar335
            + iVar336 + iVar337 + iVar338 + iVar339 + iVar340 + iVar341 + iVar342 + iVar343 +
            iVar344 + iVar345 + iVar346 + iVar347 + iVar348 + iVar349 + iVar350 + iVar351 + iVar352
            + iVar303 + iVar302 + iVar304 + iVar305 + iVar306 + iVar307 + iVar308 + iVar309 +
              iVar310 + iVar311 + iVar312 + iVar313 + iVar314 + iVar315 + iVar316 + iVar317 +
              iVar318 + iVar319 + iVar320 + iVar321 + iVar322 + iVar323 + iVar324 + iVar325 +
              iVar326 + iVar279 + iVar278 + iVar280 + iVar281 + iVar282 + iVar283 + iVar284 +
                        iVar285 + iVar286 + iVar287 + iVar288 + iVar289 + iVar290 + iVar291 +
                        iVar292 + iVar293 + iVar294 + iVar295 + iVar296 + iVar297 + iVar298 +
                        iVar299 + iVar300 + iVar301 +
                        iVar256 + iVar255 + iVar257 + iVar258 + iVar259 + iVar260 + iVar261 +
                        iVar262 + iVar263 + iVar264 + iVar265 + iVar266 + iVar267 + iVar268 +
                        iVar269 + iVar270 + iVar271 + iVar272 + iVar273 + iVar274 + iVar275 +
                        iVar276 + iVar277 +
                        iVar234 + iVar233 + iVar235 + iVar236 + iVar237 + iVar238 + iVar239 +
                        iVar240 + iVar241 + iVar242 + iVar243 + iVar244 + iVar245 + iVar246 +
                        iVar247 + iVar248 + iVar249 + iVar250 + iVar251 + iVar252 + iVar253 +
                        iVar254 + iVar213 + iVar212 + iVar214 + iVar215 + iVar216 + iVar217 +
                                  iVar218 + iVar219 + iVar220 + iVar221 + iVar222 + iVar223 +
                                  iVar224 + iVar225 + iVar226 + iVar227 + iVar228 + iVar229 +
                                  iVar230 + iVar231 + iVar232 +
                                  iVar193 + iVar192 + iVar194 + iVar195 + iVar196 + iVar197 +
                                  iVar198 + iVar199 + iVar200 + iVar201 + iVar202 + iVar203 +
                                  iVar204 + iVar205 + iVar206 + iVar207 + iVar208 + iVar209 +
                                  iVar210 + iVar211 +
                                  iVar174 + iVar173 + iVar175 + iVar176 + iVar177 + iVar178 +
                                  iVar179 + iVar180 + iVar181 + iVar182 + iVar183 + iVar184 +
                                  iVar185 + iVar186 + iVar187 + iVar188 + iVar189 + iVar190 +
                                  iVar191 + iVar156 + iVar155 + iVar157 + iVar158 + iVar159 +
                                            iVar160 + iVar161 + iVar162 + iVar163 + iVar164 +
                                            iVar165 + iVar166 + iVar167 + iVar168 + iVar169 +
                                            iVar170 + iVar171 + iVar172 +
                                            iVar139 + iVar138 + iVar140 + iVar141 + iVar142 +
                                            iVar143 + iVar144 + iVar145 + iVar146 + iVar147 +
                                            iVar148 + iVar149 + iVar150 + iVar151 + iVar152 +
                                            iVar153 + iVar154 +
                                            iVar123 + iVar122 + iVar124 + iVar125 + iVar126 +
                                            iVar127 + iVar128 + iVar129 + iVar130 + iVar131 +
                                            iVar132 + iVar133 + iVar134 + iVar135 + iVar136 +
                                            iVar137 + iVar108 + iVar107 + iVar109 + iVar110 +
                                                      iVar111 + iVar112 + iVar113 + iVar114 +
                                                      iVar115 + iVar116 + iVar117 + iVar118 +
                                                      iVar119 + iVar120 + iVar121 +
                                                      iVar94 + iVar93 + iVar95 + iVar96 + iVar97 +
                                                      iVar98 + iVar99 + iVar100 + iVar101 + iVar102
                                                      + iVar103 + iVar104 + iVar105 + iVar106 +
                                                      iVar81 + iVar80 + iVar82 + iVar83 + iVar84 +
                                                      iVar85 + iVar86 + iVar87 + iVar88 + iVar89 +
                                                      iVar90 + iVar91 + iVar92 +
                                                      iVar69 + iVar68 + iVar70 + iVar71 + iVar72 +
                                                      iVar73 + iVar74 + iVar75 + iVar76 + iVar77 +
                                                      iVar78 + iVar79 +
                                                      iVar58 + iVar57 + iVar59 + iVar60 + iVar61 +
                                                      iVar62 + iVar63 + iVar64 + iVar65 + iVar66 +
                                                      iVar67 + iVar48 + iVar47 + iVar49 + iVar50 +
                                                               iVar51 + iVar52 + iVar53 + iVar54 +
                                                               iVar55 + iVar56 +
                                                               iVar39 + iVar38 + iVar40 + iVar41 +
                                                               iVar42 + iVar43 + iVar44 + iVar45 +
                                                               iVar46 + iVar31 + iVar30 + iVar32 +
                                                                        iVar33 + iVar34 + iVar35 +
                                                                        iVar36 + iVar37 +
                                                                        iVar24 + iVar23 + iVar25 +
                                                                        iVar26 + iVar27 + iVar28 +
                                                                        iVar29 + iVar18 + iVar17 +
                                                                                 iVar19 + iVar20 +
                                                                                 iVar21 + iVar22 +
                                                                                 iVar13 + iVar12 +
                                                                                 iVar14 + iVar15 +
                                                                                 iVar16 + iVar9 + 
                                                  iVar8 + iVar10 + iVar11 +
                                                  iVar6 + iVar5 + iVar7 +
                                                  iVar4 + iVar3 + iVar2 + iVar1 + iVar454;
  if (uVar455 != 0) {
    fprintf(_stderr,"\n%d test(s) failed!\n",(ulong)uVar455);
  }
  else {
    fwrite("\nAll tests OK!\n",0xf,1,_stderr);
  }
  return (uint)(uVar455 != 0);
}

Assistant:

int main() {
	int errors = 0;

	fprintf(stderr, "Test group: equality\n");
	errors += version_test_symmetrical("0", "0", 0);
	errors += version_test_symmetrical("0a", "0a", 0);
	errors += version_test_symmetrical("a", "a", 0);
	errors += version_test_symmetrical("a0", "a0", 0);
	errors += version_test_symmetrical("0a1", "0a1", 0);
	errors += version_test_symmetrical("0a1b2", "0a1b2", 0);
	errors += version_test_symmetrical("1alpha1", "1alpha1", 0);
	errors += version_test_symmetrical("foo", "foo", 0);
	errors += version_test_symmetrical("1.2.3", "1.2.3", 0);
	errors += version_test_symmetrical("hello.world", "hello.world", 0);

	fprintf(stderr, "\nTest group: different number of components\n");
	errors += version_test_symmetrical("1", "1.0", 0);
	errors += version_test_symmetrical("1", "1.0.0", 0);
	errors += version_test_symmetrical("1.0", "1.0.0", 0);
	errors += version_test_symmetrical("1.0", "1.0.0.0.0.0.0.0", 0);

	fprintf(stderr, "\nTest group: leading zeroes\n");
	errors += version_test_symmetrical("00100.00100", "100.100", 0);
	errors += version_test_symmetrical("0", "00000000000000000", 0);

	fprintf(stderr, "\nTest group: simple comparisons\n");
	errors += version_test_symmetrical("0.0.0", "0.0.1", -1);
	errors += version_test_symmetrical("0.0.1", "0.0.2", -1);
	errors += version_test_symmetrical("0.0.2", "0.0.10", -1);
	errors += version_test_symmetrical("0.0.2", "0.1.0", -1);
	errors += version_test_symmetrical("0.0.10", "0.1.0", -1);
	errors += version_test_symmetrical("0.1.0", "0.1.1", -1);
	errors += version_test_symmetrical("0.1.1", "1.0.0", -1);
	errors += version_test_symmetrical("1.0.0", "10.0.0", -1);
	errors += version_test_symmetrical("10.0.0", "100.0.0", -1);
	errors += version_test_symmetrical("10.10000.10000", "11.0.0", -1);

	fprintf(stderr, "\nTest group: long numbers\n");
	errors += version_test_symmetrical("20160101", "20160102", -1);
	errors += version_test_symmetrical("999999999999999999", "1000000000000000000", -1);

	fprintf(stderr, "\nTest group: very long numbers\n");
	errors += version_test_symmetrical("99999999999999999999999999999999999998", "99999999999999999999999999999999999999", -1);

	fprintf(stderr, "\nTest group: letter addendum\n");
	errors += version_test_symmetrical("1.0", "1.0a", -1);
	errors += version_test_symmetrical("1.0a", "1.0b", -1);
	errors += version_test_symmetrical("1.0b", "1.1", -1);

	fprintf(stderr, "\nTest group: letter vs. number\n");
	errors += version_test_symmetrical("a", "0", -1);
	errors += version_test_symmetrical("1.a", "1.0", -1);

	fprintf(stderr, "\nTest group: letter-only component\n");
	errors += version_test_symmetrical("1.0.a", "1.0.b", -1);
	errors += version_test_symmetrical("1.0.b", "1.0.c", -1);
	errors += version_test_symmetrical("1.0.c", "1.0", -1);
	errors += version_test_symmetrical("1.0.c", "1.0.0", -1);

	fprintf(stderr, "\nTest group: letter component split\n");
	errors += version_test_symmetrical("1.0a0", "1.0.a0", 0);
	errors += version_test_symmetrical("1.0beta3", "1.0.b3", 0);

	fprintf(stderr, "\nTest group: case is ignored\n");
	errors += version_test_symmetrical("a", "A", 0);
	errors += version_test_symmetrical("1alpha", "1ALPHA", 0);
	errors += version_test_symmetrical("alpha1", "ALPHA1", 0);

	fprintf(stderr, "\nTest group: strings are shortened to one letter\n");
	errors += version_test_symmetrical("a", "alpha", 0);
	errors += version_test_symmetrical("b", "beta", 0);
	errors += version_test_symmetrical("p", "prerelease", 0);

	fprintf(stderr, "\nTest group: unusial component separators\n");
	errors += version_test_symmetrical("1.0.alpha.2", "1_0_alpha_2", 0);
	errors += version_test_symmetrical("1.0.alpha.2", "1-0-alpha-2", 0);
	errors += version_test_symmetrical("1.0.alpha.2", "1,0:alpha~2", 0);

	fprintf(stderr, "\nTest group: multiple consequentional separators\n");
	errors += version_test_symmetrical("..1....2....3..", "1.2.3", 0);
	errors += version_test_symmetrical(".-~1~-.-~2~-.", "1.2", 0);
	errors += version_test_symmetrical(".,:;~+-_", "0", 0);

	fprintf(stderr, "\nTest group: empty string\n");
	errors += version_test_symmetrical("", "", 0);
	errors += version_test_symmetrical("", "0", 0);
	errors += version_test_symmetrical("", "1", -1);

	fprintf(stderr, "\nTest group: prerelease sequence\n");
	/* XXX: is rc/pre ordering defined? */
	errors += version_test_symmetrical("1.0alpha1", "1.0alpha2", -1);
	errors += version_test_symmetrical("1.0alpha2", "1.0beta1", -1);
	errors += version_test_symmetrical("1.0beta1", "1.0beta2", -1);
	errors += version_test_symmetrical("1.0beta2", "1.0rc1", -1);
	errors += version_test_symmetrical("1.0beta2", "1.0pre1", -1);
	errors += version_test_symmetrical("1.0rc1", "1.0", -1);
	errors += version_test_symmetrical("1.0pre1", "1.0", -1);

	errors += version_test_symmetrical("1.0.alpha1", "1.0.alpha2", -1);
	errors += version_test_symmetrical("1.0.alpha2", "1.0.beta1", -1);
	errors += version_test_symmetrical("1.0.beta1", "1.0.beta2", -1);
	errors += version_test_symmetrical("1.0.beta2", "1.0.rc1", -1);
	errors += version_test_symmetrical("1.0.beta2", "1.0.pre1", -1);
	errors += version_test_symmetrical("1.0.rc1", "1.0", -1);
	errors += version_test_symmetrical("1.0.pre1", "1.0", -1);

	errors += version_test_symmetrical("1.0alpha.1", "1.0alpha.2", -1);
	errors += version_test_symmetrical("1.0alpha.2", "1.0beta.1", -1);
	errors += version_test_symmetrical("1.0beta.1", "1.0beta.2", -1);
	errors += version_test_symmetrical("1.0beta.2", "1.0rc.1", -1);
	errors += version_test_symmetrical("1.0beta.2", "1.0pre.1", -1);
	errors += version_test_symmetrical("1.0rc.1", "1.0", -1);
	errors += version_test_symmetrical("1.0pre.1", "1.0", -1);

	errors += version_test_symmetrical("1.0.alpha.1", "1.0.alpha.2", -1);
	errors += version_test_symmetrical("1.0.alpha.2", "1.0.beta.1", -1);
	errors += version_test_symmetrical("1.0.beta.1", "1.0.beta.2", -1);
	errors += version_test_symmetrical("1.0.beta.2", "1.0.rc.1", -1);
	errors += version_test_symmetrical("1.0.beta.2", "1.0.pre.1", -1);
	errors += version_test_symmetrical("1.0.rc.1", "1.0", -1);
	errors += version_test_symmetrical("1.0.pre.1", "1.0", -1);

	fprintf(stderr, "\nTest group: long word awareness\n");
	/* this should not be treated as 1.0a-1 */
	errors += version_test_symmetrical("1.0alpha-1", "0.9", 1);
	errors += version_test_symmetrical("1.0alpha-1", "1.0", -1);
	errors += version_test_symmetrical("1.0alpha-1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0alpha-1", "1.1", -1);

	errors += version_test_symmetrical("1.0beta-1", "0.9", 1);
	errors += version_test_symmetrical("1.0beta-1", "1.0", -1);
	errors += version_test_symmetrical("1.0beta-1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0beta-1", "1.1", -1);

	errors += version_test_symmetrical("1.0pre-1", "0.9", 1);
	errors += version_test_symmetrical("1.0pre-1", "1.0", -1);
	errors += version_test_symmetrical("1.0pre-1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0pre-1", "1.1", -1);

	errors += version_test_symmetrical("1.0prerelease-1", "0.9", 1);
	errors += version_test_symmetrical("1.0prerelease-1", "1.0", -1);
	errors += version_test_symmetrical("1.0prerelease-1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0prerelease-1", "1.1", -1);

	errors += version_test_symmetrical("1.0rc-1", "0.9", 1);
	errors += version_test_symmetrical("1.0rc-1", "1.0", -1);
	errors += version_test_symmetrical("1.0rc-1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0rc-1", "1.1", -1);

	fprintf(stderr, "\nTest group: post-release keyword awareness\n");
	/* this should not be treated as 1.0a-1 */
	errors += version_test_symmetrical("1.0patch1", "0.9", 1);
	errors += version_test_symmetrical("1.0patch1", "1.0", 1);
	errors += version_test_symmetrical("1.0patch1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0patch1", "1.1", -1);

	errors += version_test_symmetrical("1.0.patch1", "0.9", 1);
	errors += version_test_symmetrical("1.0.patch1", "1.0", 1);
	errors += version_test_symmetrical("1.0.patch1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0.patch1", "1.1", -1);

	errors += version_test_symmetrical("1.0patch.1", "0.9", 1);
	errors += version_test_symmetrical("1.0patch.1", "1.0", 1);
	errors += version_test_symmetrical("1.0patch.1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0patch.1", "1.1", -1);

	errors += version_test_symmetrical("1.0.patch.1", "0.9", 1);
	errors += version_test_symmetrical("1.0.patch.1", "1.0", 1);
	errors += version_test_symmetrical("1.0.patch.1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0.patch.1", "1.1", -1);

	errors += version_test_symmetrical("1.0post1", "0.9", 1);
	errors += version_test_symmetrical("1.0post1", "1.0", 1);
	errors += version_test_symmetrical("1.0post1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0post1", "1.1", -1);

	errors += version_test_symmetrical("1.0postanythinggoeshere1", "0.9", 1);
	errors += version_test_symmetrical("1.0postanythinggoeshere1", "1.0", 1);
	errors += version_test_symmetrical("1.0postanythinggoeshere1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0postanythinggoeshere1", "1.1", -1);

	errors += version_test_symmetrical("1.0pl1", "0.9", 1);
	errors += version_test_symmetrical("1.0pl1", "1.0", 1);
	errors += version_test_symmetrical("1.0pl1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0pl1", "1.1", -1);

	errors += version_test_symmetrical("1.0errata1", "0.9", 1);
	errors += version_test_symmetrical("1.0errata1", "1.0", 1);
	errors += version_test_symmetrical("1.0errata1", "1.0.1", -1);
	errors += version_test_symmetrical("1.0errata1", "1.1", -1);

	fprintf(stderr, "\nTest group: p is patch flag\n");
	errors += version_test_symmetrical_flags("1.0p1", "1.0p1", 0, 0, 0);
	errors += version_test_symmetrical_flags("1.0p1", "1.0p1", VERSIONFLAG_P_IS_PATCH, VERSIONFLAG_P_IS_PATCH, 0);
	errors += version_test_symmetrical_flags("1.0p1", "1.0p1", VERSIONFLAG_P_IS_PATCH, 0, 1);
	errors += version_test_symmetrical_flags("1.0p1", "1.0p1", 0, VERSIONFLAG_P_IS_PATCH, -1);

	errors += version_test_symmetrical_flags("1.0p1", "1.0P1", 0, 0, 0);
	errors += version_test_symmetrical_flags("1.0p1", "1.0P1", VERSIONFLAG_P_IS_PATCH, VERSIONFLAG_P_IS_PATCH, 0);

	errors += version_test_symmetrical_flags("1.0", "1.0p1", 0, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0p1", VERSIONFLAG_P_IS_PATCH, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0p1", 0, VERSIONFLAG_P_IS_PATCH, -1);

	errors += version_test_symmetrical_flags("1.0", "1.0.p1", 0, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0.p1", VERSIONFLAG_P_IS_PATCH, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0.p1", 0, VERSIONFLAG_P_IS_PATCH, -1);

	errors += version_test_symmetrical_flags("1.0", "1.0.p.1", 0, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0.p.1", VERSIONFLAG_P_IS_PATCH, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0.p.1", 0, VERSIONFLAG_P_IS_PATCH, -1);

	/* this case is not affected */
	errors += version_test_symmetrical_flags("1.0", "1.0p.1", 0, 0, -1);
	errors += version_test_symmetrical_flags("1.0", "1.0p.1", VERSIONFLAG_P_IS_PATCH, 0, -1);
	errors += version_test_symmetrical_flags("1.0", "1.0p.1", 0, VERSIONFLAG_P_IS_PATCH, -1);

	fprintf(stderr, "\nTest group: any is patch flag\n");
	errors += version_test_symmetrical_flags("1.0a1", "1.0a1", 0, 0, 0);
	errors += version_test_symmetrical_flags("1.0a1", "1.0a1", VERSIONFLAG_ANY_IS_PATCH, VERSIONFLAG_ANY_IS_PATCH, 0);
	errors += version_test_symmetrical_flags("1.0a1", "1.0a1", VERSIONFLAG_ANY_IS_PATCH, 0, 1);
	errors += version_test_symmetrical_flags("1.0a1", "1.0a1", 0, VERSIONFLAG_ANY_IS_PATCH, -1);

	errors += version_test_symmetrical_flags("1.0", "1.0a1", 0, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0a1", VERSIONFLAG_ANY_IS_PATCH, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0a1", 0, VERSIONFLAG_ANY_IS_PATCH, -1);

	errors += version_test_symmetrical_flags("1.0", "1.0.a1", 0, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0.a1", VERSIONFLAG_ANY_IS_PATCH, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0.a1", 0, VERSIONFLAG_ANY_IS_PATCH, -1);

	errors += version_test_symmetrical_flags("1.0", "1.0.a.1", 0, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0.a.1", VERSIONFLAG_ANY_IS_PATCH, 0, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0.a.1", 0, VERSIONFLAG_ANY_IS_PATCH, -1);

	/* this case is not affected */
	errors += version_test_symmetrical_flags("1.0", "1.0a.1", 0, 0, -1);
	errors += version_test_symmetrical_flags("1.0", "1.0a.1", VERSIONFLAG_ANY_IS_PATCH, 0, -1);
	errors += version_test_symmetrical_flags("1.0", "1.0a.1", 0, VERSIONFLAG_ANY_IS_PATCH, -1);

	fprintf(stderr, "\nTest group: p/patch compatibility\n");
	errors += version_test_symmetrical_flags("1.0p1", "1.0pre1", 0, 0, 0);
	errors += version_test_symmetrical_flags("1.0p1", "1.0patch1", 0, 0, -1);
	errors += version_test_symmetrical_flags("1.0p1", "1.0post1", 0, 0, -1);

	errors += version_test_symmetrical_flags("1.0p1", "1.0pre1", VERSIONFLAG_P_IS_PATCH, VERSIONFLAG_P_IS_PATCH, 1);
	errors += version_test_symmetrical_flags("1.0p1", "1.0patch1", VERSIONFLAG_P_IS_PATCH, VERSIONFLAG_P_IS_PATCH, 0);
	errors += version_test_symmetrical_flags("1.0p1", "1.0post1", VERSIONFLAG_P_IS_PATCH, VERSIONFLAG_P_IS_PATCH, 0);

	fprintf(stderr, "\nTest group: prerelease words without numbers\n");
	errors += version_test_symmetrical("1.0alpha", "1.0", -1);
	errors += version_test_symmetrical("1.0.alpha", "1.0", -1);

	errors += version_test_symmetrical("1.0beta", "1.0", -1);
	errors += version_test_symmetrical("1.0.beta", "1.0", -1);

	errors += version_test_symmetrical("1.0rc", "1.0", -1);
	errors += version_test_symmetrical("1.0.rc", "1.0", -1);

	errors += version_test_symmetrical("1.0pre", "1.0", -1);
	errors += version_test_symmetrical("1.0.pre", "1.0", -1);

	errors += version_test_symmetrical("1.0prerelese", "1.0", -1);
	errors += version_test_symmetrical("1.0.prerelese", "1.0", -1);

	errors += version_test_symmetrical("1.0patch", "1.0", 1);
	errors += version_test_symmetrical("1.0.patch", "1.0", 1);

	fprintf(stderr, "\nTest group: release bounds\n");
	errors += version_test_symmetrical_flags("0.99999", "1.0", 0, 0, -1);
	errors += version_test_symmetrical_flags("1.0alpha", "1.0", 0, 0, -1);
	errors += version_test_symmetrical_flags("1.0alpha0", "1.0", 0, 0, -1);
	errors += version_test_symmetrical_flags("1.0", "1.0", 0, 0, 0);
	errors += version_test_symmetrical_flags("1.0patch", "1.0", 0, 0, 1);
	errors += version_test_symmetrical_flags("1.0patch0", "1.0", 0, 0, 1);
	errors += version_test_symmetrical_flags("1.0.1", "1.0", 0, 0, 1);
	errors += version_test_symmetrical_flags("1.1", "1.0", 0, 0, 1);

	errors += version_test_symmetrical_flags("0.99999", "1.0", 0, VERSIONFLAG_LOWER_BOUND, -1);
	errors += version_test_symmetrical_flags("1.0alpha", "1.0", 0, VERSIONFLAG_LOWER_BOUND, 1);
	errors += version_test_symmetrical_flags("1.0alpha0", "1.0", 0, VERSIONFLAG_LOWER_BOUND, 1);
	errors += version_test_symmetrical_flags("1.0", "1.0", 0, VERSIONFLAG_LOWER_BOUND, 1);
	errors += version_test_symmetrical_flags("1.0patch", "1.0", 0, VERSIONFLAG_LOWER_BOUND, 1);
	errors += version_test_symmetrical_flags("1.0patch0", "1.0", 0, VERSIONFLAG_LOWER_BOUND, 1);
	errors += version_test_symmetrical_flags("1.0a", "1.0", 0, VERSIONFLAG_LOWER_BOUND, 1);
	errors += version_test_symmetrical_flags("1.0.1", "1.0", 0, VERSIONFLAG_LOWER_BOUND, 1);
	errors += version_test_symmetrical_flags("1.1", "1.0", 0, VERSIONFLAG_LOWER_BOUND, 1);

	errors += version_test_symmetrical_flags("0.99999", "1.0", 0, VERSIONFLAG_UPPER_BOUND, -1);
	errors += version_test_symmetrical_flags("1.0alpha", "1.0", 0, VERSIONFLAG_UPPER_BOUND, -1);
	errors += version_test_symmetrical_flags("1.0alpha0", "1.0", 0, VERSIONFLAG_UPPER_BOUND, -1);
	errors += version_test_symmetrical_flags("1.0", "1.0", 0, VERSIONFLAG_UPPER_BOUND, -1);
	errors += version_test_symmetrical_flags("1.0patch", "1.0", 0, VERSIONFLAG_UPPER_BOUND, -1);
	errors += version_test_symmetrical_flags("1.0patch0", "1.0", 0, VERSIONFLAG_UPPER_BOUND, -1);
	errors += version_test_symmetrical_flags("1.0a", "1.0", 0, VERSIONFLAG_UPPER_BOUND, -1);
	errors += version_test_symmetrical_flags("1.0.1", "1.0", 0, VERSIONFLAG_UPPER_BOUND, -1);
	errors += version_test_symmetrical_flags("1.1", "1.0", 0, VERSIONFLAG_UPPER_BOUND, 1);

	errors += version_test_symmetrical_flags("1.0", "1.0", VERSIONFLAG_LOWER_BOUND, VERSIONFLAG_LOWER_BOUND, 0);
	errors += version_test_symmetrical_flags("1.0", "1.0", VERSIONFLAG_UPPER_BOUND, VERSIONFLAG_UPPER_BOUND, 0);
	errors += version_test_symmetrical_flags("1.0", "1.0", VERSIONFLAG_LOWER_BOUND, VERSIONFLAG_UPPER_BOUND, -1);

	errors += version_test_symmetrical_flags("1.0", "1.1", VERSIONFLAG_UPPER_BOUND, VERSIONFLAG_LOWER_BOUND, -1);

	errors += version_test_symmetrical_flags("0", "0.0", VERSIONFLAG_UPPER_BOUND, VERSIONFLAG_UPPER_BOUND, 1);
	errors += version_test_symmetrical_flags("0", "0.0", VERSIONFLAG_LOWER_BOUND, VERSIONFLAG_LOWER_BOUND, -1);

	fprintf(stderr, "\nTest group: uniform component splitting\n");
	errors += version_test_symmetrical("1.0alpha1", "1.0alpha1", 0);
	errors += version_test_symmetrical("1.0alpha1", "1.0.alpha1", 0);
	errors += version_test_symmetrical("1.0alpha1", "1.0alpha.1", 0);
	errors += version_test_symmetrical("1.0alpha1", "1.0.alpha.1", 0);

	errors += version_test_symmetrical("1.0patch1", "1.0patch1", 0);
	errors += version_test_symmetrical("1.0patch1", "1.0.patch1", 0);
	errors += version_test_symmetrical("1.0patch1", "1.0patch.1", 0);
	errors += version_test_symmetrical("1.0patch1", "1.0.patch.1", 0);

	/* controversial - TBD
	fprintf(stderr, "\nTest group: letter vs. numeric component ordering\n");
	errors += version_test_symmetrical("1.0", "1.0a", -1);
	errors += version_test_symmetrical("1.0a", "1.0.1", -1);
	*/

	if (errors) {
		fprintf(stderr, "\n%d test(s) failed!\n", errors);
		return 1;
	}

	fprintf(stderr, "\nAll tests OK!\n");
	return 0;
}